

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O3

int Sfm_TimTrace(Sfm_Tim_t *p)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  int *piVar4;
  Vec_Ptr_t *pVVar5;
  long *plVar6;
  void **ppvVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  Vec_Ptr_t *__ptr;
  int *piVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  size_t __size;
  long lVar14;
  long lVar15;
  int iVar16;
  int iVar18;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  
  __ptr = Abc_NtkDfs(p->pNtk,1);
  if (0 < __ptr->nSize) {
    lVar15 = 0;
    do {
      pvVar3 = __ptr->pArray[lVar15];
      uVar1 = *(uint *)((long)pvVar3 + 0x10);
      if ((int)uVar1 < 0) goto LAB_0053c534;
      piVar10 = (int *)((ulong)uVar1 * 2);
      iVar12 = (p->vTimArrs).nSize;
      if (iVar12 <= (int)piVar10) goto LAB_0053c515;
      iVar18 = *(int *)((long)pvVar3 + 0x1c);
      if (6 < (long)iVar18) {
        __assert_fail("Abc_ObjFaninNum(pNode) <= 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmTim.c"
                      ,0x67,"void Sfm_TimNodeArrival(Sfm_Tim_t *, Abc_Obj_t *)");
      }
      piVar4 = (p->vTimArrs).pArray;
      if (0 < iVar18) {
        lVar13 = *(long *)((long)pvVar3 + 0x20);
        lVar14 = 0;
        do {
          uVar2 = *(uint *)(lVar13 + lVar14 * 4);
          if ((int)uVar2 < 0) goto LAB_0053c534;
          if (iVar12 <= (int)(uVar2 * 2)) goto LAB_0053c515;
          *(int **)(&stack0xffffffffffffffa8 + lVar14 * 8) = piVar4 + (ulong)uVar2 * 2;
          lVar14 = lVar14 + 1;
        } while (iVar18 != lVar14);
      }
      Sfm_TimGateArrival(*(Sfm_Tim_t **)((long)pvVar3 + 0x38),(Mio_Gate_t *)&stack0xffffffffffffffa8
                         ,(int **)(piVar4 + (ulong)uVar1 * 2),piVar10);
      lVar15 = lVar15 + 1;
    } while (lVar15 < __ptr->nSize);
  }
  pVVar5 = p->pNtk->vCos;
  lVar15 = (long)pVVar5->nSize;
  if (lVar15 < 1) {
    iVar12 = 0;
  }
  else {
    lVar13 = 0;
    iVar12 = 0;
    do {
      plVar6 = (long *)pVVar5->pArray[lVar13];
      uVar1 = *(uint *)(*(long *)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                 (long)*(int *)plVar6[4] * 8) + 0x10);
      if ((int)uVar1 < 0) goto LAB_0053c534;
      if ((p->vTimArrs).nSize <= (int)(uVar1 * 2)) goto LAB_0053c515;
      piVar10 = (p->vTimArrs).pArray;
      iVar18 = piVar10[(ulong)uVar1 * 2];
      iVar16 = piVar10[(ulong)uVar1 * 2 + 1];
      if (iVar16 < iVar18) {
        iVar16 = iVar18;
      }
      if (iVar12 <= iVar16) {
        iVar12 = iVar16;
      }
      lVar13 = lVar13 + 1;
    } while (lVar15 != lVar13);
  }
  iVar18 = p->pNtk->vObjs->nSize;
  uVar11 = (long)iVar18 * 2;
  iVar16 = (int)uVar11;
  if ((p->vTimReqs).nCap < iVar16) {
    piVar10 = (p->vTimReqs).pArray;
    __size = (long)iVar18 << 3;
    if (piVar10 == (int *)0x0) {
      piVar10 = (int *)malloc(__size);
    }
    else {
      piVar10 = (int *)realloc(piVar10,__size);
    }
    (p->vTimReqs).pArray = piVar10;
    if (piVar10 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vTimReqs).nCap = iVar16;
  }
  auVar9 = _DAT_0094e250;
  if (0 < iVar18) {
    piVar10 = (p->vTimReqs).pArray;
    lVar15 = (uVar11 & 0xffffffff) - 1;
    auVar17._8_4_ = (int)lVar15;
    auVar17._0_8_ = lVar15;
    auVar17._12_4_ = (int)((ulong)lVar15 >> 0x20);
    uVar11 = 0;
    auVar17 = auVar17 ^ _DAT_0094e250;
    auVar19 = _DAT_0094f530;
    auVar20 = _DAT_0094e240;
    do {
      auVar21 = auVar20 ^ auVar9;
      iVar18 = auVar17._4_4_;
      if ((bool)(~(auVar21._4_4_ == iVar18 && auVar17._0_4_ < auVar21._0_4_ ||
                  iVar18 < auVar21._4_4_) & 1)) {
        piVar10[uVar11] = 1000000000;
      }
      if ((auVar21._12_4_ != auVar17._12_4_ || auVar21._8_4_ <= auVar17._8_4_) &&
          auVar21._12_4_ <= auVar17._12_4_) {
        piVar10[uVar11 + 1] = 1000000000;
      }
      auVar21 = auVar19 ^ auVar9;
      iVar22 = auVar21._4_4_;
      if (iVar22 <= iVar18 && (iVar22 != iVar18 || auVar21._0_4_ <= auVar17._0_4_)) {
        piVar10[uVar11 + 2] = 1000000000;
        piVar10[uVar11 + 3] = 1000000000;
      }
      uVar11 = uVar11 + 4;
      lVar15 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 4;
      auVar20._8_8_ = lVar15 + 4;
      lVar15 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 4;
      auVar19._8_8_ = lVar15 + 4;
    } while ((iVar16 + 3U & 0xfffffffc) != uVar11);
  }
  (p->vTimReqs).nSize = iVar16;
  pVVar5 = p->pNtk->vCos;
  if (0 < pVVar5->nSize) {
    ppvVar7 = pVVar5->pArray;
    lVar15 = 0;
    do {
      uVar1 = *(uint *)(*(long *)(*(long *)(*(long *)(*ppvVar7[lVar15] + 0x20) + 8) +
                                 (long)**(int **)((long)ppvVar7[lVar15] + 0x20) * 8) + 0x10);
      if ((int)uVar1 < 0) {
LAB_0053c534:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      if ((p->vTimReqs).nSize <= (int)(uVar1 * 2)) {
LAB_0053c515:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar10 = (p->vTimReqs).pArray;
      piVar10[(ulong)uVar1 * 2 + 1] = iVar12;
      piVar10[(ulong)uVar1 * 2] = iVar12;
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar5->nSize);
  }
  lVar15 = (long)__ptr->nSize;
  if (0 < (long)__ptr->nSize) {
    do {
      if (__ptr->nSize < lVar15) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Sfm_TimNodeRequired(p,(Abc_Obj_t *)__ptr->pArray[lVar15 + -1]);
      bVar8 = 1 < lVar15;
      lVar15 = lVar15 + -1;
    } while (bVar8);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return iVar12;
}

Assistant:

int Sfm_TimTrace( Sfm_Tim_t * p )
{
    Abc_Obj_t * pObj; int i, Delay = 0;
    Vec_Ptr_t * vNodes = Abc_NtkDfs( p->pNtk, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Sfm_TimNodeArrival( p, pObj );
    Abc_NtkForEachCo( p->pNtk, pObj, i )
        Delay = Abc_MaxInt( Delay, Sfm_TimArrMax(p, Abc_ObjFanin0(pObj)) );
    Vec_IntFill( &p->vTimReqs, 2*Abc_NtkObjNumMax(p->pNtk), ABC_INFINITY );
    Abc_NtkForEachCo( p->pNtk, pObj, i )
        Sfm_TimSetReq( p, Abc_ObjFanin0(pObj), Delay );
    Vec_PtrForEachEntryReverse( Abc_Obj_t *, vNodes, pObj, i )
        Sfm_TimNodeRequired( p, pObj );
    Vec_PtrFree( vNodes );
    return Delay;
}